

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
NEST::NESTcalc::GetBoyleModelDL(void)

{
  double (*__range1) [25] [2];
  double (*iP) [2];
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *in_RDI;
  long lVar1;
  double modelDL [25] [2];
  double local_1a8 [50];
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  memcpy(local_1a8,&DAT_00114f30,400);
  for (lVar1 = 0; lVar1 != 400; lVar1 = lVar1 + 0x10) {
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double_const&,double_const&>
              (in_RDI,(double *)((long)local_1a8 + lVar1),(double *)((long)local_1a8 + lVar1 + 8));
  }
  return (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)in_RDI;
}

Assistant:

std::vector<std::pair<double, double> > NESTcalc::GetBoyleModelDL() {
  std::vector<std::pair<double, double> > output;
  const int nPts = 25;
  constexpr double modelDL[nPts][2] = {
      {14.6236, 22.2977},  {24.5646, 22.4238},  {36.675, 22.933},
      {53.4802, 23.4595},  {74.3939, 25.4994},  {111.071, 29.4632},
      {173.835, 33.9251},  {306.106, 38.1019},  {467.921, 37.2352},
      {749.809, 31.8425},  {1093.38, 25.495},   {1711.25, 18.3343},
      {2615.85, 12.6461},  {3998.65, 8.51594},  {6258.24, 5.23814},
      {9794.71, 3.01815},  {16453.1, 1.58294},  {27637.8, 0.779995},
      {38445.7, 0.525689}, {49828.3, 0.364016}, {70967.5, 0.228694},
      {98719.8, 0.148206}, {127948, 0.116139},  {169785, 0.0957632},
      {220053, 0.0900259}};
  for (auto &iP : modelDL) {
    output.emplace_back(iP[0], iP[1]);
  }
  return output;
}